

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsprg.cpp
# Opt level: O3

void __thiscall CTcParser::write_to_object_file(CTcParser *this,CVmFile *fp)

{
  long lVar1;
  CTcParser *pCVar2;
  uint32_t tmp_1;
  long lVar3;
  CVmHashEntry *pCVar4;
  long lVar5;
  long lVar6;
  CTcGramProdEntry *pCVar7;
  CTcPrsExport *pCVar8;
  tcprs_nonsym_obj *ptVar9;
  uint32_t tmp_7;
  uint uVar10;
  uint32_t tmp;
  uint uVar11;
  char b_3 [4];
  prs_wsf_ctx ctx;
  uint local_54;
  CTcParser *local_50;
  undefined8 local_48;
  CVmFile *local_40;
  CTcParser *local_38;
  
  this->obj_file_dict_idx_ = 1;
  this->obj_file_sym_idx_ = 1;
  lVar3 = ftell((FILE *)fp->fp_);
  lVar1 = fp->seek_base_;
  uVar11 = 0;
  local_48._0_4_ = 0;
  CVmFile::write_bytes(fp,(char *)&local_48,4);
  local_48._0_4_ = 0;
  CVmFile::write_bytes(fp,(char *)&local_48,4);
  local_48 = (ulong)local_48._4_4_ << 0x20;
  CVmFile::write_bytes(fp,(char *)&local_48,4);
  local_48 = 0;
  local_40 = fp;
  local_38 = this;
  CTcPrsSymtab::enum_entries(this->global_symtab_,write_obj_cb,&local_48);
  pCVar4 = (CVmHashEntry *)this->anon_obj_head_;
  if (pCVar4 != (CVmHashEntry *)0x0) {
    uVar11 = 0;
    do {
      uVar11 = uVar11 + 1;
      pCVar4 = pCVar4->nxt_;
    } while (pCVar4 != (CVmHashEntry *)0x0);
  }
  local_54 = uVar11;
  CVmFile::write_bytes(fp,(char *)&local_54,4);
  for (pCVar4 = (CVmHashEntry *)this->anon_obj_head_; pCVar4 != (CVmHashEntry *)0x0;
      pCVar4 = pCVar4->nxt_) {
    (*(((CTcSymObjBase *)&pCVar4->_vptr_CVmHashEntry)->super_CTcSymbol).super_CTcSymbolBase.
      super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry[9])(pCVar4,fp);
  }
  local_54 = 0;
  for (ptVar9 = this->nonsym_obj_head_; ptVar9 != (tcprs_nonsym_obj *)0x0; ptVar9 = ptVar9->nxt_) {
    local_54 = local_54 + 1;
  }
  CVmFile::write_bytes(fp,(char *)&local_54,4);
  ptVar9 = this->nonsym_obj_head_;
  local_50 = this;
  if (ptVar9 != (tcprs_nonsym_obj *)0x0) {
    do {
      local_54 = ptVar9->id_;
      CVmFile::write_bytes(fp,(char *)&local_54,4);
      ptVar9 = ptVar9->nxt_;
    } while (ptVar9 != (tcprs_nonsym_obj *)0x0);
  }
  lVar5 = ftell((FILE *)fp->fp_);
  lVar6 = fp->seek_base_;
  uVar10 = 0;
  fseek((FILE *)fp->fp_,(lVar3 - lVar1) + lVar6,0);
  pCVar2 = local_50;
  local_54 = local_50->obj_file_sym_idx_;
  CVmFile::write_bytes(fp,(char *)&local_54,4);
  local_54 = pCVar2->obj_file_dict_idx_;
  CVmFile::write_bytes(fp,(char *)&local_54,4);
  local_54 = (uint)local_48;
  CVmFile::write_bytes(fp,(char *)&local_54,4);
  fseek((FILE *)fp->fp_,(lVar5 - lVar6) + fp->seek_base_,0);
  lVar6 = ftell((FILE *)fp->fp_);
  lVar1 = fp->seek_base_;
  local_54 = 0;
  CVmFile::write_bytes(fp,(char *)&local_54,4);
  pCVar2 = local_50;
  local_48 = 0;
  CTcPrsSymtab::enum_entries(local_50->global_symtab_,write_obj_ref_cb,&local_48);
  lVar5 = ftell((FILE *)fp->fp_);
  lVar3 = fp->seek_base_;
  fseek((FILE *)fp->fp_,(lVar6 - lVar1) + lVar3,0);
  local_54 = (uint)local_48;
  CVmFile::write_bytes(fp,(char *)&local_54,4);
  fseek((FILE *)fp->fp_,(lVar5 - lVar3) + fp->seek_base_,0);
  local_54 = uVar11;
  CVmFile::write_bytes(fp,(char *)&local_54,4);
  for (pCVar4 = (CVmHashEntry *)pCVar2->anon_obj_head_; pCVar4 != (CVmHashEntry *)0x0;
      pCVar4 = pCVar4->nxt_) {
    (*(((CTcSymObjBase *)&pCVar4->_vptr_CVmHashEntry)->super_CTcSymbol).super_CTcSymbolBase.
      super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry[10])(pCVar4,fp);
  }
  pCVar7 = pCVar2->gramprod_head_;
  if (pCVar7 != (CTcGramProdEntry *)0x0) {
    uVar10 = 0;
    do {
      uVar10 = uVar10 + 1;
      pCVar7 = pCVar7->nxt_;
    } while (pCVar7 != (CTcGramProdEntry *)0x0);
  }
  local_54 = uVar10;
  CVmFile::write_bytes(fp,(char *)&local_54,4);
  for (pCVar7 = pCVar2->gramprod_head_; pCVar7 != (CTcGramProdEntry *)0x0; pCVar7 = pCVar7->nxt_) {
    CTcGramProdEntry::write_to_obj_file(pCVar7,fp);
  }
  lVar6 = ftell((FILE *)fp->fp_);
  lVar1 = fp->seek_base_;
  local_54 = 0;
  CVmFile::write_bytes(fp,(char *)&local_54,4);
  local_48 = 0;
  CTcPrsSymtab::enum_entries(pCVar2->global_symtab_,write_obj_gram_cb,&local_48);
  lVar5 = ftell((FILE *)fp->fp_);
  lVar3 = fp->seek_base_;
  uVar11 = 0;
  fseek((FILE *)fp->fp_,(lVar6 - lVar1) + lVar3,0);
  local_54 = (uint)local_48;
  CVmFile::write_bytes(fp,(char *)&local_54,4);
  pCVar2 = local_50;
  fseek((FILE *)fp->fp_,(lVar5 - lVar3) + fp->seek_base_,0);
  pCVar8 = pCVar2->exp_head_;
  if (pCVar8 != (CTcPrsExport *)0x0) {
    uVar11 = 0;
    do {
      uVar11 = uVar11 + 1;
      pCVar8 = pCVar8->nxt_;
    } while (pCVar8 != (CTcPrsExport *)0x0);
  }
  local_54 = uVar11;
  CVmFile::write_bytes(fp,(char *)&local_54,4);
  for (pCVar8 = pCVar2->exp_head_; pCVar8 != (CTcPrsExport *)0x0; pCVar8 = pCVar8->nxt_) {
    CTcPrsExport::write_to_obj_file(pCVar8,fp);
  }
  return;
}

Assistant:

void CTcParser::write_to_object_file(CVmFile *fp)
{
    prs_wsf_ctx ctx;
    long cnt_ofs;
    long end_ofs;
    ulong anon_cnt;
    ulong nonsym_cnt;
    tcprs_nonsym_obj *nonsym;
    CTcSymObj *anon_obj;
    CTcGramProdEntry *prod;
    ulong prod_cnt;
    CTcPrsExport *exp;
    ulong exp_cnt;

    /* 
     *   reset the object file symbol and dictionary index values - start
     *   with 1, since 0 is a "null pointer" index value 
     */
    obj_file_sym_idx_ = 1;
    obj_file_dict_idx_ = 1;

    /* 
     *   write a placeholder for the symbol index table count, the
     *   dictionary table count, and the actual symbol count 
     */
    cnt_ofs = fp->get_pos();
    fp->write_uint4(0);
    fp->write_uint4(0);
    fp->write_uint4(0);

    /* write each entry from the global symbol table */
    ctx.cnt = 0;
    ctx.fp = fp;
    ctx.prs = this;
    global_symtab_->enum_entries(&write_obj_cb, &ctx);

    /* count the anonymous objects */
    for (anon_cnt = 0, anon_obj = anon_obj_head_ ; anon_obj != 0 ;
         ++anon_cnt, anon_obj = (CTcSymObj *)anon_obj->nxt_) ;

    /* write the number of anonymous objects */
    fp->write_uint4(anon_cnt);

    /* write the anonymous objects */
    for (anon_obj = anon_obj_head_ ; anon_obj != 0 ;
         anon_obj = (CTcSymObj *)anon_obj->nxt_)
    {
        /* write this anonymous object */
        anon_obj->write_to_obj_file(fp);
    }

    /* count the non-symbol objects */
    for (nonsym_cnt = 0, nonsym = nonsym_obj_head_ ; nonsym != 0 ;
         ++nonsym_cnt, nonsym = nonsym->nxt_) ;

    /* write the non-symbol object ID's */
    fp->write_uint4(nonsym_cnt);
    for (nonsym = nonsym_obj_head_ ; nonsym != 0 ; nonsym = nonsym->nxt_)
        fp->write_uint4((ulong)nonsym->id_);

    /* remember where we are, and seek back to the counters for fixup */
    end_ofs = fp->get_pos();
    fp->set_pos(cnt_ofs);

    /* write the actual symbol index count */
    fp->write_uint4(obj_file_sym_idx_);

    /* write the actual dictionary index count */
    fp->write_uint4(obj_file_dict_idx_);

    /* write the total named symbol count */
    fp->write_uint4(ctx.cnt);

    /* 
     *   seek back to the ending offset so we can continue on to write the
     *   remainder of the file 
     */
    fp->set_pos(end_ofs);

    /* write a placeholder for the symbol cross-reference entries */
    cnt_ofs = fp->get_pos();
    fp->write_uint4(0);

    /* 
     *   enumerate entries again, this time writing cross-object
     *   references (this must be done after we've written out the main
     *   part of each object, so that we have a full table of all of the
     *   objects loaded before we write any references) 
     */
    ctx.cnt = 0;
    global_symtab_->enum_entries(&write_obj_ref_cb, &ctx);

    /* go back and fix up the cross-reference count */
    end_ofs = fp->get_pos();
    fp->set_pos(cnt_ofs);
    fp->write_uint4(ctx.cnt);
    fp->set_pos(end_ofs);

    /* write the anonymous object cross-references */
    fp->write_uint4(anon_cnt);
    for (anon_obj = anon_obj_head_ ; anon_obj != 0 ;
         anon_obj = (CTcSymObj *)anon_obj->nxt_)
    {
        /* write this anonymous object's cross-references */
        anon_obj->write_refs_to_obj_file(fp);
    }

    /* count the grammar productions */
    for (prod_cnt = 0, prod = gramprod_head_ ; prod != 0 ;
         ++prod_cnt, prod = prod->get_next()) ;

    /* write the number of productions */
    fp->write_uint4(prod_cnt);

    /* 
     *   write the main list of grammar rules - this is the list of
     *   productions that are associated with anonymous match objects and
     *   hence cannot be replaced or modified 
     */
    for (prod = gramprod_head_ ; prod != 0 ; prod = prod->get_next())
    {
        /* write this entry */
        prod->write_to_obj_file(fp);
    }

    /* write a placeholder for the named grammar rule count */
    cnt_ofs = fp->get_pos();
    fp->write_uint4(0);

    /* 
     *   write the private grammar rules - this is the set of rules
     *   associated with named match objects, so we write these by
     *   enumerating the symbol table again through the grammar rule writer
     *   callback 
     */
    ctx.cnt = 0;
    global_symtab_->enum_entries(&write_obj_gram_cb, &ctx);

    /* go back and fix up the named grammar rule count */
    end_ofs = fp->get_pos();
    fp->set_pos(cnt_ofs);
    fp->write_uint4(ctx.cnt);
    fp->set_pos(end_ofs);

    /* count the exports */
    for (exp_cnt = 0, exp = exp_head_ ; exp != 0 ;
         ++exp_cnt, exp = exp->get_next());

    /* write the number of exports */
    fp->write_uint4(exp_cnt);

    /* write the exports */
    for (exp = exp_head_ ; exp != 0 ; exp = exp->get_next())
    {
        /* write this entry */
        exp->write_to_obj_file(fp);
    }
}